

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_rp_qsort(nk_rp_rect *array,uint len,_func_int_void_ptr_void_ptr *cmp)

{
  int iVar1;
  undefined4 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined8 uVar5;
  nk_rp_coord nVar6;
  nk_rp_coord nVar7;
  nk_rp_coord nVar8;
  nk_rp_coord nVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  nk_rp_rect *pnVar15;
  nk_rp_rect *pnVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  nk_rp_rect tmp;
  nk_rp_rect pivot;
  uint stack [64];
  int local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  int iStack_14c;
  int local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  int iStack_13c;
  uint local_138 [66];
  
  uVar12 = (len >> 1) * 0x10dcd + 1;
  uVar14 = 0;
  uVar13 = 0;
  while( true ) {
    uVar17 = (uint)uVar13;
    iVar1 = (int)uVar14;
    if (iVar1 + 1U < len) {
      do {
        bVar19 = (int)uVar13 == 0x40;
        if (bVar19) {
          len = local_138[0];
        }
        uVar11 = (ulong)len;
        if (bVar19) {
          uVar13 = 0;
        }
        pnVar15 = array + (uVar12 % (len - iVar1) + iVar1);
        local_148 = pnVar15->id;
        uStack_144._0_2_ = pnVar15->w;
        uStack_144._2_2_ = pnVar15->h;
        uStack_140._0_2_ = pnVar15->x;
        uStack_140._2_2_ = pnVar15->y;
        iStack_13c = pnVar15->was_packed;
        uVar12 = uVar12 * 0x10dcd + 1;
        local_138[uVar13] = len;
        uVar18 = (ulong)(iVar1 - 1);
        while( true ) {
          do {
            uVar17 = (int)uVar18 + 1;
            uVar18 = (ulong)uVar17;
            pnVar15 = array + uVar18;
            iVar10 = (*cmp)(pnVar15,&local_148);
          } while (iVar10 < 0);
          do {
            uVar14 = uVar11;
            len = (uint)uVar14;
            uVar11 = (ulong)(len - 1);
            pnVar16 = array + uVar11;
            iVar10 = (*cmp)(&local_148,pnVar16);
          } while (iVar10 < 0);
          if (len - 1 <= uVar17) break;
          uVar2 = pnVar15->id;
          uVar3 = pnVar15->w;
          uVar4 = pnVar15->h;
          uVar5._0_2_ = pnVar15->x;
          uVar5._2_2_ = pnVar15->y;
          uVar5._4_4_ = pnVar15->was_packed;
          nVar6 = pnVar16->w;
          nVar7 = pnVar16->h;
          nVar8 = pnVar16->x;
          nVar9 = pnVar16->y;
          iVar10 = pnVar16->was_packed;
          pnVar15->id = pnVar16->id;
          pnVar15->w = nVar6;
          pnVar15->h = nVar7;
          pnVar15->x = nVar8;
          pnVar15->y = nVar9;
          pnVar15->was_packed = iVar10;
          uStack_150 = (undefined4)uVar5;
          pnVar16->id = uVar2;
          pnVar16->w = uVar3;
          pnVar16->h = uVar4;
          pnVar16->x = (undefined2)uStack_150;
          pnVar16->y = uStack_150._2_2_;
          pnVar16->was_packed = uVar5._4_4_;
        }
        uVar17 = (int)uVar13 + 1;
        uVar13 = (ulong)uVar17;
      } while (iVar1 + 1U < len);
    }
    else {
      uVar14 = (ulong)len;
    }
    if (uVar17 == 0) break;
    uVar13 = (ulong)(uVar17 - 1);
    len = local_138[uVar13];
  }
  return;
}

Assistant:

static void
nk_rp_qsort(struct nk_rp_rect *array, unsigned int len, int(*cmp)(const void*,const void*))
{
    /* iterative quick sort */
    #define NK_MAX_SORT_STACK 64
    unsigned right, left = 0, stack[NK_MAX_SORT_STACK], pos = 0;
    unsigned seed = len/2 * 69069+1;
    for (;;) {
        for (; left+1 < len; len++) {
            struct nk_rp_rect pivot, tmp;
            if (pos == NK_MAX_SORT_STACK) len = stack[pos = 0];
            pivot = array[left+seed%(len-left)];
            seed = seed * 69069 + 1;
            stack[pos++] = len;
            for (right = left-1;;) {
                while (cmp(&array[++right], &pivot) < 0);
                while (cmp(&pivot, &array[--len]) < 0);
                if (right >= len) break;
                tmp = array[right];
                array[right] = array[len];
                array[len] = tmp;
            }
        }
        if (pos == 0) break;
        left = len;
        len = stack[--pos];
    }
    #undef NK_MAX_SORT_STACK
}